

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_function_binary_tests.cc
# Opt level: O3

void __thiscall
lf::mesh::utils::test::meshFunctionBinary_Addition_Test::TestBody
          (meshFunctionBinary_Addition_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var2;
  MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:60:37)>
  *pMVar3;
  MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:64:5)>
  *pMVar4;
  MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:70:5)>
  *pMVar5;
  MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:76:5)>
  *pMVar6;
  void *pvVar7;
  bool bVar8;
  RefEl RVar9;
  RefElType RVar10;
  dim_t dVar11;
  int iVar12;
  string *psVar13;
  undefined8 *puVar14;
  Scalar *pSVar15;
  Scalar *pSVar16;
  Scalar *pSVar17;
  Scalar *pSVar18;
  Scalar *pSVar19;
  AssertHelperData *pAVar20;
  CommaInitializer<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *pCVar21;
  Matrix<double,_2,_2,_0,_2,_2> *pMVar22;
  undefined8 extraout_RAX;
  Scalar *pSVar23;
  undefined8 uVar24;
  string *in_RCX;
  long lVar25;
  ulong uVar26;
  Index col;
  DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *this_00;
  DenseCoeffsBase<Eigen::Array<double,__1,__1,_0,__1,__1>,_1> *this_01;
  _func_int *p_Var27;
  int in_R9D;
  double dVar28;
  Index IVar29;
  long lVar30;
  bool bVar31;
  shared_ptr<lf::mesh::Mesh> sVar32;
  undefined1 auVar33 [16];
  AssertionResult AVar34;
  MeshFunctionBinary<lf::mesh::utils::internal::OperatorAddition,_lf::mesh::utils::MeshFunctionConstant<lf::mesh::utils::test::X>,_lf::mesh::utils::MeshFunctionConstant<lf::mesh::utils::test::X>_>
  a;
  QuadRule qr;
  MatrixXd global_points;
  vector<double,_std::allocator<double>_> vals1;
  vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
  vals2_1;
  shared_ptr<lf::mesh::Mesh> mesh;
  vector<double,_std::allocator<double>_> vals2;
  vector<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
  vals2_9;
  vector<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
  vals1_9;
  stringstream ss;
  undefined1 local_4c8 [8];
  Entity local_4c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4b8;
  double *local_4a8;
  undefined1 local_498 [16];
  undefined1 local_488 [16];
  undefined1 local_478 [32];
  Matrix<double,_2,_2,_0,_2,_2> local_458;
  double local_438;
  string local_430;
  double *local_410;
  Index IStack_408;
  undefined8 local_400;
  string *local_3f8;
  undefined8 *local_3f0;
  Scalar local_3e8;
  undefined8 uStack_3e0;
  test *local_3d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_3d0;
  Matrix<double,__1,__1,_0,__1,__1> local_3c8;
  vector<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
  local_3a8;
  string *local_388;
  vector<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
  local_380;
  undefined1 local_368 [8];
  Entity EStack_360;
  long local_358;
  Index IStack_350;
  double *local_348;
  Index IStack_340;
  undefined8 local_338;
  double local_1d8;
  double local_1d0;
  double local_1c8;
  OperatorAddition local_1c0 [8];
  undefined **local_1b8;
  undefined **local_1a8;
  OperatorAddition local_198 [8];
  undefined **local_190;
  undefined **local_180;
  OperatorAddition local_170 [8];
  undefined **local_168;
  undefined **local_158;
  OperatorAddition local_148 [8];
  undefined **local_140;
  undefined **local_130;
  OperatorAddition local_120 [8];
  undefined **local_118;
  undefined **local_108;
  OperatorAddition local_f8 [8];
  undefined **local_f0;
  undefined **local_e0;
  OperatorAddition local_d0 [8];
  undefined **local_c8;
  undefined **local_b8;
  OperatorAddition local_a8 [8];
  undefined **local_a0;
  undefined **local_90;
  OperatorAddition local_80 [8];
  undefined **local_78;
  undefined **local_68;
  OperatorAddition local_58 [8];
  undefined **local_50;
  undefined **local_40;
  
  sVar32 = test_utils::GenerateHybrid2DTestMesh((test_utils *)&local_3d8,0,1.0);
  local_50 = &PTR__MeshFunctionGlobal_0046f280;
  local_40 = &PTR__MeshFunctionGlobal_0046f2b0;
  auVar33 = (**(code **)(*(long *)local_3d8 + 0x10))
                      (local_3d8,0,
                       sVar32.super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi._M_pi);
  psVar13 = auVar33._0_8_;
  if (auVar33._8_8_ != 0) {
    in_RCX = (string *)(&psVar13->_M_dataplus + auVar33._8_8_);
    local_388 = in_RCX;
    do {
      _Var2._M_head_impl =
           (((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              *)&(psVar13->_M_dataplus)._M_p)->
           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
      local_3f8 = psVar13;
      RVar9.type_ = (**(code **)(*(long *)_Var2._M_head_impl + 0x20))(_Var2._M_head_impl);
      quad::make_QuadRule((QuadRule *)local_4c8,RVar9,5);
      MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_binary_tests.cc:57:5)>
      ::operator()((vector<double,_std::allocator<double>_> *)local_368,
                   (MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:57:5)>
                    *)_Var2._M_head_impl,&local_4c0,(MatrixXd *)in_RCX);
      MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_binary_tests.cc:59:24)>
      ::operator()((vector<double,_std::allocator<double>_> *)&local_430,
                   (MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:59:24)>
                    *)_Var2._M_head_impl,&local_4c0,(MatrixXd *)in_RCX);
      internal::OperatorAddition::operator()<double,_double>
                ((vector<double,_std::allocator<double>_> *)&local_458,local_58,
                 (vector<double,_std::allocator<double>_> *)local_368,
                 (vector<double,_std::allocator<double>_> *)&local_430,0);
      if ((long *)local_430._M_dataplus._M_p != (long *)0x0) {
        operator_delete(local_430._M_dataplus._M_p,
                        CONCAT26(local_430.field_2._M_allocated_capacity._6_2_,
                                 CONCAT24(local_430.field_2._M_allocated_capacity._4_2_,
                                          local_430.field_2._M_allocated_capacity._0_4_)) -
                        (long)local_430._M_dataplus._M_p);
      }
      if (local_368 != (undefined1  [8])0x0) {
        operator_delete((void *)local_368,local_358 - (long)local_368);
      }
      RVar10 = (**(code **)(*(long *)_Var2._M_head_impl + 0x20))(_Var2._M_head_impl);
      dVar11 = base::internal::DimensionImpl(RVar10);
      if ((pointer)local_4b8._M_allocated_capacity != (pointer)(ulong)dVar11) {
        std::__cxx11::stringstream::stringstream((stringstream *)local_368);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_358,"mismatch between entity dimension and local.rows()",0x32);
        paVar1 = &local_430.field_2;
        local_430._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_430,"e.RefEl().Dimension() == local.rows()","");
        pAVar20 = (AssertHelperData *)(local_498 + 0x10);
        local_498._0_8_ = pAVar20;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_498,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/mesh_function_global.h"
                   ,"");
        std::__cxx11::stringbuf::str();
        base::AssertionFailed(&local_430,(string *)local_498,0x50,(string *)local_478);
        if ((undefined1 *)local_478._0_8_ != local_478 + 0x10) {
          operator_delete((void *)local_478._0_8_,CONCAT71(local_478._17_7_,local_478[0x10]) + 1);
        }
        if ((AssertHelperData *)local_498._0_8_ != pAVar20) {
          operator_delete((void *)local_498._0_8_,(ulong)(local_488._0_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_430._M_dataplus._M_p != paVar1) {
          operator_delete(local_430._M_dataplus._M_p,
                          CONCAT26(local_430.field_2._M_allocated_capacity._6_2_,
                                   CONCAT24(local_430.field_2._M_allocated_capacity._4_2_,
                                            local_430.field_2._M_allocated_capacity._0_4_)) + 1);
        }
        local_430.field_2._M_allocated_capacity._0_4_ = 0x736c6166;
        local_430.field_2._M_allocated_capacity._4_2_ = 0x65;
        local_430._M_string_length = 5;
        local_498._0_8_ = pAVar20;
        local_430._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_498,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/mesh_function_global.h"
                   ,"");
        local_478._8_8_ = 0;
        local_478[0x10] = '\0';
        local_478._0_8_ = local_478 + 0x10;
        base::AssertionFailed(&local_430,(string *)local_498,0x50,(string *)local_478);
        goto LAB_00121569;
      }
      local_3c8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
           (double *)0x0;
      local_3c8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
           0;
      local_3c8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
           0;
      std::vector<double,_std::allocator<double>_>::reserve
                ((vector<double,_std::allocator<double>_> *)&local_3c8,local_4b8._8_8_);
      puVar14 = (undefined8 *)(**(code **)(*(long *)_Var2._M_head_impl + 0x18))(_Var2._M_head_impl);
      in_RCX = (string *)*puVar14;
      (**(code **)((long)&in_RCX->field_2 + 8))
                ((Matrix<double,__1,__1,_0,__1,__1> *)local_498,puVar14,&local_4c0);
      if (0 < (long)local_4b8._8_8_) {
        lVar25 = 0;
        do {
          Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
                    ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)&local_430,
                     (Matrix<double,__1,__1,_0,__1,__1> *)local_498,lVar25);
          local_338 = local_400;
          local_358 = CONCAT26(local_430.field_2._M_allocated_capacity._6_2_,
                               CONCAT24(local_430.field_2._M_allocated_capacity._4_2_,
                                        local_430.field_2._M_allocated_capacity._0_4_));
          local_348 = local_410;
          IStack_340 = IStack_408;
          IStack_350 = local_430.field_2._8_8_;
          local_368 = (undefined1  [8])local_430._M_dataplus._M_p;
          EStack_360._vptr_Entity = (_func_int **)local_430._M_string_length;
          pSVar15 = Eigen::
                    DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_1>
                    ::operator[]((DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
                                  *)local_368,0);
          local_3e8 = *pSVar15;
          pSVar15 = Eigen::
                    DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_1>
                    ::operator[]((DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
                                  *)local_368,0);
          local_438 = *pSVar15;
          pSVar15 = Eigen::
                    DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_1>
                    ::operator[]((DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
                                  *)local_368,1);
          local_3f0 = (undefined8 *)*pSVar15;
          pSVar15 = Eigen::
                    DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_1>
                    ::operator[]((DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
                                  *)local_368,0);
          local_478._0_8_ = local_3e8 * local_438 + (double)local_3f0 + (double)local_3f0 + *pSVar15
          ;
          if (local_3c8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_rows == local_3c8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                        m_storage.m_cols) {
            std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                      ((vector<double,_std::allocator<double>_> *)&local_3c8,
                       (iterator)
                       local_3c8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                       m_storage.m_rows,(double *)local_478);
          }
          else {
            *(undefined8 *)
             local_3c8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_rows = local_478._0_8_;
            local_3c8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_rows = local_3c8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_rows + 8;
          }
          lVar25 = lVar25 + 1;
        } while (lVar25 < (long)local_4b8._8_8_);
      }
      free((void *)local_498._0_8_);
      if (local_458.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.
          array[1] !=
          local_458.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.
          array[0]) {
        uVar26 = 0;
        do {
          local_430._M_dataplus._M_p =
               (pointer)(*(double *)
                          ((long)local_458.
                                 super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
                                 m_storage.m_data.array[0] + uVar26 * 8) -
                        local_3c8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                        m_storage.m_data[uVar26]);
          local_498._0_8_ = &DAT_3ddb7cdfd9d7bdbb;
          in_RCX = &local_430;
          testing::internal::CmpHelperLT<double,double>
                    ((internal *)local_368,"vals1[i] - vals2[i]","1e-10",(double *)&local_430,
                     (double *)local_498);
          if ((DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
               )local_368[0] ==
              (DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
               )0x0) {
            testing::Message::Message((Message *)&local_430);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_430._M_dataplus._M_p + 0x10),"i=",2);
            std::ostream::operator<<(local_430._M_dataplus._M_p + 0x10,(int)uVar26);
            p_Var27 = (_func_int *)0x3c7fe6;
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                EStack_360._vptr_Entity !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              p_Var27 = *EStack_360._vptr_Entity;
            }
            in_RCX = (string *)0x1a;
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)local_498,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_utils.h"
                       ,0x1a,(char *)p_Var27);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)local_498,(Message *)&local_430);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_498);
            if ((long *)local_430._M_dataplus._M_p != (long *)0x0) {
              (**(code **)(*(long *)local_430._M_dataplus._M_p + 8))();
            }
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              EStack_360._vptr_Entity !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&EStack_360,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         EStack_360._vptr_Entity);
          }
          uVar26 = uVar26 + 1;
        } while (uVar26 < (ulong)((long)local_458.
                                        super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>
                                        .m_storage.m_data.array[1] -
                                  (long)local_458.
                                        super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>
                                        .m_storage.m_data.array[0] >> 3));
      }
      if (local_3c8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_data != (double *)0x0) {
        operator_delete(local_3c8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                        m_storage.m_data,
                        local_3c8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                        m_storage.m_cols -
                        (long)local_3c8.
                              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                              m_storage.m_data);
      }
      if ((undefined1 *)
          local_458.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.
          array[0] != (undefined1 *)0x0) {
        operator_delete((void *)local_458.
                                super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
                                m_storage.m_data.array[0],
                        (long)local_458.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>
                              .m_storage.m_data.array[2] -
                        (long)local_458.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>
                              .m_storage.m_data.array[0]);
      }
      free(local_4a8);
      free(local_4c0._vptr_Entity);
      psVar13 = (string *)&local_3f8->_M_string_length;
    } while (psVar13 != local_388);
  }
  local_78 = &PTR__MeshFunctionGlobal_0046f340;
  local_68 = &PTR__MeshFunctionGlobal_0046f370;
  auVar33 = (**(code **)(*(long *)local_3d8 + 0x10))(local_3d8,0);
  puVar14 = auVar33._0_8_;
  if (auVar33._8_8_ != 0) {
    in_RCX = (string *)(puVar14 + auVar33._8_8_);
    local_3f8 = in_RCX;
    do {
      pMVar3 = (MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:60:37)>
                *)*puVar14;
      local_3f0 = puVar14;
      iVar12 = (*pMVar3->_vptr_MeshFunctionGlobal[4])(pMVar3);
      quad::make_QuadRule((QuadRule *)local_368,(RefEl)(RefElType)iVar12,5);
      MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_binary_tests.cc:60:37)>
      ::operator()((vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                    *)&local_430,pMVar3,&EStack_360,(MatrixXd *)in_RCX);
      MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_binary_tests.cc:62:5)>
      ::operator()((vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                    *)local_4c8,
                   (MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:62:5)>
                    *)pMVar3,&EStack_360,(MatrixXd *)in_RCX);
      in_RCX = (string *)local_4c8;
      internal::OperatorAddition::operator()
                ((vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                  *)local_498,local_80,
                 (vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                  *)&local_430,
                 (vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                  *)local_4c8,0);
      pvVar7 = (void *)CONCAT71(local_4c8._1_7_,local_4c8[0]);
      if (pvVar7 != (void *)0x0) {
        operator_delete(pvVar7,local_4b8._M_allocated_capacity - (long)pvVar7);
      }
      if ((long *)local_430._M_dataplus._M_p != (long *)0x0) {
        operator_delete(local_430._M_dataplus._M_p,
                        CONCAT26(local_430.field_2._M_allocated_capacity._6_2_,
                                 CONCAT24(local_430.field_2._M_allocated_capacity._4_2_,
                                          local_430.field_2._M_allocated_capacity._0_4_)) -
                        (long)local_430._M_dataplus._M_p);
      }
      MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_binary_tests.cc:104:7)>
      ::operator()((vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                    *)&local_430,
                   (MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:104:7)>
                    *)pMVar3,&EStack_360,(MatrixXd *)in_RCX);
      if (local_498._8_8_ != local_498._0_8_) {
        dVar28 = 0.0;
        do {
          local_478._0_8_ = (long *)0x2;
          local_458.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.
          array[0] = 9.88131291682493e-324;
          testing::internal::CmpHelperEQ<long,long>
                    ((internal *)local_4c8,"vals1[i].rows()","vals2[i].rows()",(long *)local_478,
                     (long *)&local_458);
          if (local_4c8[0] == 0) {
            testing::Message::Message((Message *)local_478);
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                local_4c0._vptr_Entity ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              p_Var27 = (_func_int *)0x3c7fe6;
            }
            else {
              p_Var27 = *local_4c0._vptr_Entity;
            }
            in_RCX = (string *)0x27;
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_458,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_utils.h"
                       ,0x27,(char *)p_Var27);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_458,(Message *)local_478);
LAB_0011ec61:
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_458);
            if ((long *)local_478._0_8_ != (long *)0x0) {
              (**(code **)(*(long *)local_478._0_8_ + 8))();
            }
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                local_4c0._vptr_Entity !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_4c0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_4c0._vptr_Entity);
            }
            if ((long *)local_430._M_dataplus._M_p != (long *)0x0) {
              operator_delete(local_430._M_dataplus._M_p,
                              CONCAT26(local_430.field_2._M_allocated_capacity._6_2_,
                                       CONCAT24(local_430.field_2._M_allocated_capacity._4_2_,
                                                local_430.field_2._M_allocated_capacity._0_4_)) -
                              (long)local_430._M_dataplus._M_p);
            }
            if ((AssertHelperData *)local_498._0_8_ != (AssertHelperData *)0x0) {
              operator_delete((void *)local_498._0_8_,local_488._0_8_ - local_498._0_8_);
            }
            free(local_348);
            free(EStack_360._vptr_Entity);
            goto LAB_0011ecdd;
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              local_4c0._vptr_Entity !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_4c0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_4c0._vptr_Entity);
          }
          local_478._0_8_ = (long *)0x1;
          local_458.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.
          array[0] = 4.94065645841247e-324;
          testing::internal::CmpHelperEQ<long,long>
                    ((internal *)local_4c8,"vals1[i].cols()","vals2[i].cols()",(long *)local_478,
                     (long *)&local_458);
          if (local_4c8[0] == 0) {
            testing::Message::Message((Message *)local_478);
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                local_4c0._vptr_Entity ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              p_Var27 = (_func_int *)0x3c7fe6;
            }
            else {
              p_Var27 = *local_4c0._vptr_Entity;
            }
            in_RCX = (string *)0x28;
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_458,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_utils.h"
                       ,0x28,(char *)p_Var27);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_458,(Message *)local_478);
            goto LAB_0011ec61;
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              local_4c0._vptr_Entity !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_4c0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_4c0._vptr_Entity);
          }
          IVar29 = 0;
          bVar8 = true;
          local_438 = dVar28;
          do {
            bVar31 = bVar8;
            pSVar16 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::operator()
                                ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)
                                 (local_498._0_8_ + (long)dVar28 * 0x10),IVar29,0);
            local_3e8 = *pSVar16;
            uStack_3e0 = 0;
            pSVar16 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::operator()
                                ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)
                                 (local_430._M_dataplus._M_p + (long)dVar28 * 0x10),IVar29,0);
            local_478._0_8_ = ABS(local_3e8 - *pSVar16);
            local_458.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.
            array[0] = (double)&DAT_3ddb7cdfd9d7bdbb;
            in_RCX = (string *)local_478;
            testing::internal::CmpHelperLT<double,double>
                      ((internal *)local_4c8,"std::abs(vals1[i](r, c) - vals2[i](r, c))","1e-10",
                       (double *)local_478,(double *)&local_458);
            if (local_4c8[0] == 0) {
              testing::Message::Message((Message *)local_478);
              p_Var27 = (_func_int *)0x3c7fe6;
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_4c0._vptr_Entity !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                p_Var27 = *local_4c0._vptr_Entity;
              }
              in_RCX = (string *)0x2b;
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_458,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_utils.h"
                         ,0x2b,(char *)p_Var27);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_458,(Message *)local_478);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_458);
              if ((long *)local_478._0_8_ != (long *)0x0) {
                (**(code **)(*(long *)local_478._0_8_ + 8))();
              }
            }
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                local_4c0._vptr_Entity !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_4c0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_4c0._vptr_Entity);
            }
            IVar29 = 1;
            bVar8 = false;
          } while (bVar31);
          dVar28 = (double)((long)local_438 + 1);
        } while ((ulong)dVar28 < (ulong)((long)(local_498._8_8_ - local_498._0_8_) >> 4));
      }
      if ((long *)local_430._M_dataplus._M_p != (long *)0x0) {
        operator_delete(local_430._M_dataplus._M_p,
                        CONCAT26(local_430.field_2._M_allocated_capacity._6_2_,
                                 CONCAT24(local_430.field_2._M_allocated_capacity._4_2_,
                                          local_430.field_2._M_allocated_capacity._0_4_)) -
                        (long)local_430._M_dataplus._M_p);
      }
      if ((AssertHelperData *)local_498._0_8_ != (AssertHelperData *)0x0) {
        operator_delete((void *)local_498._0_8_,local_488._0_8_ - local_498._0_8_);
      }
      free(local_348);
      free(EStack_360._vptr_Entity);
      puVar14 = local_3f0 + 1;
    } while ((string *)puVar14 != local_3f8);
  }
LAB_0011ecdd:
  local_a0 = &PTR__MeshFunctionGlobal_0046f3a0;
  local_90 = &PTR__MeshFunctionGlobal_0046f370;
  auVar33 = (**(code **)(*(long *)local_3d8 + 0x10))(local_3d8,0);
  puVar14 = auVar33._0_8_;
  if (auVar33._8_8_ != 0) {
    in_RCX = (string *)(puVar14 + auVar33._8_8_);
    local_3f8 = in_RCX;
    do {
      pMVar4 = (MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:64:5)>
                *)*puVar14;
      local_3f0 = puVar14;
      iVar12 = (*pMVar4->_vptr_MeshFunctionGlobal[4])(pMVar4);
      quad::make_QuadRule((QuadRule *)local_368,(RefEl)(RefElType)iVar12,5);
      MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_binary_tests.cc:64:5)>
      ::operator()((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    *)&local_430,pMVar4,&EStack_360,(MatrixXd *)in_RCX);
      MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_binary_tests.cc:62:5)>
      ::operator()((vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                    *)local_4c8,
                   (MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:62:5)>
                    *)pMVar4,&EStack_360,(MatrixXd *)in_RCX);
      in_RCX = (string *)local_4c8;
      internal::OperatorAddition::operator()
                ((vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                  *)local_498,local_a8,
                 (vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)&local_430,
                 (vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                  *)local_4c8,0);
      pvVar7 = (void *)CONCAT71(local_4c8._1_7_,local_4c8[0]);
      if (pvVar7 != (void *)0x0) {
        operator_delete(pvVar7,local_4b8._M_allocated_capacity - (long)pvVar7);
      }
      std::
      vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
      ::~vector((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                 *)&local_430);
      MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_binary_tests.cc:104:7)>
      ::operator()((vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                    *)&local_430,
                   (MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:104:7)>
                    *)pMVar4,&EStack_360,(MatrixXd *)in_RCX);
      if (local_498._8_8_ != local_498._0_8_) {
        dVar28 = 0.0;
        do {
          local_478._0_8_ = (long *)0x2;
          local_458.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.
          array[0] = 9.88131291682493e-324;
          testing::internal::CmpHelperEQ<long,long>
                    ((internal *)local_4c8,"vals1[i].rows()","vals2[i].rows()",(long *)local_478,
                     (long *)&local_458);
          if (local_4c8[0] == 0) {
            testing::Message::Message((Message *)local_478);
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                local_4c0._vptr_Entity ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              p_Var27 = (_func_int *)0x3c7fe6;
            }
            else {
              p_Var27 = *local_4c0._vptr_Entity;
            }
            in_RCX = (string *)0x27;
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_458,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_utils.h"
                       ,0x27,(char *)p_Var27);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_458,(Message *)local_478);
LAB_0011f0c3:
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_458);
            if ((long *)local_478._0_8_ != (long *)0x0) {
              (**(code **)(*(long *)local_478._0_8_ + 8))();
            }
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                local_4c0._vptr_Entity !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_4c0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_4c0._vptr_Entity);
            }
            if ((long *)local_430._M_dataplus._M_p != (long *)0x0) {
              operator_delete(local_430._M_dataplus._M_p,
                              CONCAT26(local_430.field_2._M_allocated_capacity._6_2_,
                                       CONCAT24(local_430.field_2._M_allocated_capacity._4_2_,
                                                local_430.field_2._M_allocated_capacity._0_4_)) -
                              (long)local_430._M_dataplus._M_p);
            }
            if ((AssertHelperData *)local_498._0_8_ != (AssertHelperData *)0x0) {
              operator_delete((void *)local_498._0_8_,local_488._0_8_ - local_498._0_8_);
            }
            free(local_348);
            free(EStack_360._vptr_Entity);
            goto LAB_0011f13f;
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              local_4c0._vptr_Entity !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_4c0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_4c0._vptr_Entity);
          }
          local_478._0_8_ = (long *)0x1;
          local_458.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.
          array[0] = 4.94065645841247e-324;
          testing::internal::CmpHelperEQ<long,long>
                    ((internal *)local_4c8,"vals1[i].cols()","vals2[i].cols()",(long *)local_478,
                     (long *)&local_458);
          if (local_4c8[0] == 0) {
            testing::Message::Message((Message *)local_478);
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                local_4c0._vptr_Entity ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              p_Var27 = (_func_int *)0x3c7fe6;
            }
            else {
              p_Var27 = *local_4c0._vptr_Entity;
            }
            in_RCX = (string *)0x28;
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_458,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_utils.h"
                       ,0x28,(char *)p_Var27);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_458,(Message *)local_478);
            goto LAB_0011f0c3;
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              local_4c0._vptr_Entity !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_4c0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_4c0._vptr_Entity);
          }
          IVar29 = 0;
          bVar8 = true;
          local_438 = dVar28;
          do {
            bVar31 = bVar8;
            pSVar16 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::operator()
                                ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)
                                 (local_498._0_8_ + (long)dVar28 * 0x10),IVar29,0);
            local_3e8 = *pSVar16;
            uStack_3e0 = 0;
            pSVar16 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::operator()
                                ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)
                                 (local_430._M_dataplus._M_p + (long)dVar28 * 0x10),IVar29,0);
            local_478._0_8_ = ABS(local_3e8 - *pSVar16);
            local_458.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.
            array[0] = (double)&DAT_3ddb7cdfd9d7bdbb;
            in_RCX = (string *)local_478;
            testing::internal::CmpHelperLT<double,double>
                      ((internal *)local_4c8,"std::abs(vals1[i](r, c) - vals2[i](r, c))","1e-10",
                       (double *)local_478,(double *)&local_458);
            if (local_4c8[0] == 0) {
              testing::Message::Message((Message *)local_478);
              p_Var27 = (_func_int *)0x3c7fe6;
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_4c0._vptr_Entity !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                p_Var27 = *local_4c0._vptr_Entity;
              }
              in_RCX = (string *)0x2b;
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_458,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_utils.h"
                         ,0x2b,(char *)p_Var27);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_458,(Message *)local_478);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_458);
              if ((long *)local_478._0_8_ != (long *)0x0) {
                (**(code **)(*(long *)local_478._0_8_ + 8))();
              }
            }
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                local_4c0._vptr_Entity !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_4c0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_4c0._vptr_Entity);
            }
            IVar29 = 1;
            bVar8 = false;
          } while (bVar31);
          dVar28 = (double)((long)local_438 + 1);
        } while ((ulong)dVar28 < (ulong)((long)(local_498._8_8_ - local_498._0_8_) >> 4));
      }
      if ((long *)local_430._M_dataplus._M_p != (long *)0x0) {
        operator_delete(local_430._M_dataplus._M_p,
                        CONCAT26(local_430.field_2._M_allocated_capacity._6_2_,
                                 CONCAT24(local_430.field_2._M_allocated_capacity._4_2_,
                                          local_430.field_2._M_allocated_capacity._0_4_)) -
                        (long)local_430._M_dataplus._M_p);
      }
      if ((AssertHelperData *)local_498._0_8_ != (AssertHelperData *)0x0) {
        operator_delete((void *)local_498._0_8_,local_488._0_8_ - local_498._0_8_);
      }
      free(local_348);
      free(EStack_360._vptr_Entity);
      puVar14 = local_3f0 + 1;
    } while ((string *)puVar14 != local_3f8);
  }
LAB_0011f13f:
  local_c8 = &PTR__MeshFunctionGlobal_0046f340;
  local_b8 = &PTR__MeshFunctionGlobal_0046f3d0;
  auVar33 = (**(code **)(*(long *)local_3d8 + 0x10))(local_3d8,0);
  puVar14 = auVar33._0_8_;
  if (auVar33._8_8_ != 0) {
    in_RCX = (string *)(puVar14 + auVar33._8_8_);
    local_3f8 = in_RCX;
    do {
      pMVar3 = (MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:60:37)>
                *)*puVar14;
      local_3f0 = puVar14;
      iVar12 = (*pMVar3->_vptr_MeshFunctionGlobal[4])(pMVar3);
      quad::make_QuadRule((QuadRule *)local_368,(RefEl)(RefElType)iVar12,5);
      MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_binary_tests.cc:60:37)>
      ::operator()((vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                    *)&local_430,pMVar3,&EStack_360,(MatrixXd *)in_RCX);
      MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_binary_tests.cc:65:45)>
      ::operator()((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    *)local_4c8,
                   (MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:65:45)>
                    *)pMVar3,&EStack_360,(MatrixXd *)in_RCX);
      in_RCX = (string *)local_4c8;
      internal::OperatorAddition::operator()
                ((vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                  *)local_498,local_d0,
                 (vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                  *)&local_430,
                 (vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)local_4c8,0);
      std::
      vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
      ::~vector((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                 *)local_4c8);
      if ((long *)local_430._M_dataplus._M_p != (long *)0x0) {
        operator_delete(local_430._M_dataplus._M_p,
                        CONCAT26(local_430.field_2._M_allocated_capacity._6_2_,
                                 CONCAT24(local_430.field_2._M_allocated_capacity._4_2_,
                                          local_430.field_2._M_allocated_capacity._0_4_)) -
                        (long)local_430._M_dataplus._M_p);
      }
      MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_binary_tests.cc:104:7)>
      ::operator()((vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                    *)&local_430,
                   (MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:104:7)>
                    *)pMVar3,&EStack_360,(MatrixXd *)in_RCX);
      if (local_498._8_8_ != local_498._0_8_) {
        dVar28 = 0.0;
        do {
          local_478._0_8_ = (long *)0x2;
          local_458.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.
          array[0] = 9.88131291682493e-324;
          testing::internal::CmpHelperEQ<long,long>
                    ((internal *)local_4c8,"vals1[i].rows()","vals2[i].rows()",(long *)local_478,
                     (long *)&local_458);
          if (local_4c8[0] == 0) {
            testing::Message::Message((Message *)local_478);
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                local_4c0._vptr_Entity ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              p_Var27 = (_func_int *)0x3c7fe6;
            }
            else {
              p_Var27 = *local_4c0._vptr_Entity;
            }
            in_RCX = (string *)0x27;
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_458,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_utils.h"
                       ,0x27,(char *)p_Var27);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_458,(Message *)local_478);
LAB_0011f528:
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_458);
            if ((long *)local_478._0_8_ != (long *)0x0) {
              (**(code **)(*(long *)local_478._0_8_ + 8))();
            }
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                local_4c0._vptr_Entity !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_4c0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_4c0._vptr_Entity);
            }
            if ((long *)local_430._M_dataplus._M_p != (long *)0x0) {
              operator_delete(local_430._M_dataplus._M_p,
                              CONCAT26(local_430.field_2._M_allocated_capacity._6_2_,
                                       CONCAT24(local_430.field_2._M_allocated_capacity._4_2_,
                                                local_430.field_2._M_allocated_capacity._0_4_)) -
                              (long)local_430._M_dataplus._M_p);
            }
            if ((AssertHelperData *)local_498._0_8_ != (AssertHelperData *)0x0) {
              operator_delete((void *)local_498._0_8_,local_488._0_8_ - local_498._0_8_);
            }
            free(local_348);
            free(EStack_360._vptr_Entity);
            goto LAB_0011f5a4;
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              local_4c0._vptr_Entity !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_4c0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_4c0._vptr_Entity);
          }
          local_478._0_8_ = (long *)0x1;
          local_458.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.
          array[0] = 4.94065645841247e-324;
          testing::internal::CmpHelperEQ<long,long>
                    ((internal *)local_4c8,"vals1[i].cols()","vals2[i].cols()",(long *)local_478,
                     (long *)&local_458);
          if (local_4c8[0] == 0) {
            testing::Message::Message((Message *)local_478);
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                local_4c0._vptr_Entity ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              p_Var27 = (_func_int *)0x3c7fe6;
            }
            else {
              p_Var27 = *local_4c0._vptr_Entity;
            }
            in_RCX = (string *)0x28;
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_458,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_utils.h"
                       ,0x28,(char *)p_Var27);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_458,(Message *)local_478);
            goto LAB_0011f528;
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              local_4c0._vptr_Entity !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_4c0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_4c0._vptr_Entity);
          }
          IVar29 = 0;
          bVar8 = true;
          local_438 = dVar28;
          do {
            bVar31 = bVar8;
            pSVar16 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::operator()
                                ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)
                                 (local_498._0_8_ + (long)dVar28 * 0x10),IVar29,0);
            local_3e8 = *pSVar16;
            uStack_3e0 = 0;
            pSVar16 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::operator()
                                ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)
                                 (local_430._M_dataplus._M_p + (long)dVar28 * 0x10),IVar29,0);
            local_478._0_8_ = ABS(local_3e8 - *pSVar16);
            local_458.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.
            array[0] = (double)&DAT_3ddb7cdfd9d7bdbb;
            in_RCX = (string *)local_478;
            testing::internal::CmpHelperLT<double,double>
                      ((internal *)local_4c8,"std::abs(vals1[i](r, c) - vals2[i](r, c))","1e-10",
                       (double *)local_478,(double *)&local_458);
            if (local_4c8[0] == 0) {
              testing::Message::Message((Message *)local_478);
              p_Var27 = (_func_int *)0x3c7fe6;
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_4c0._vptr_Entity !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                p_Var27 = *local_4c0._vptr_Entity;
              }
              in_RCX = (string *)0x2b;
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_458,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_utils.h"
                         ,0x2b,(char *)p_Var27);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_458,(Message *)local_478);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_458);
              if ((long *)local_478._0_8_ != (long *)0x0) {
                (**(code **)(*(long *)local_478._0_8_ + 8))();
              }
            }
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                local_4c0._vptr_Entity !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_4c0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_4c0._vptr_Entity);
            }
            IVar29 = 1;
            bVar8 = false;
          } while (bVar31);
          dVar28 = (double)((long)local_438 + 1);
        } while ((ulong)dVar28 < (ulong)((long)(local_498._8_8_ - local_498._0_8_) >> 4));
      }
      if ((long *)local_430._M_dataplus._M_p != (long *)0x0) {
        operator_delete(local_430._M_dataplus._M_p,
                        CONCAT26(local_430.field_2._M_allocated_capacity._6_2_,
                                 CONCAT24(local_430.field_2._M_allocated_capacity._4_2_,
                                          local_430.field_2._M_allocated_capacity._0_4_)) -
                        (long)local_430._M_dataplus._M_p);
      }
      if ((AssertHelperData *)local_498._0_8_ != (AssertHelperData *)0x0) {
        operator_delete((void *)local_498._0_8_,local_488._0_8_ - local_498._0_8_);
      }
      free(local_348);
      free(EStack_360._vptr_Entity);
      puVar14 = local_3f0 + 1;
    } while ((string *)puVar14 != local_3f8);
  }
LAB_0011f5a4:
  local_f0 = &PTR__MeshFunctionGlobal_0046f3a0;
  local_e0 = &PTR__MeshFunctionGlobal_0046f3d0;
  auVar33 = (**(code **)(*(long *)local_3d8 + 0x10))(local_3d8,0);
  puVar14 = auVar33._0_8_;
  if (auVar33._8_8_ != 0) {
    local_3f8 = (string *)(puVar14 + auVar33._8_8_);
    do {
      pMVar4 = (MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:64:5)>
                *)*puVar14;
      iVar12 = (*pMVar4->_vptr_MeshFunctionGlobal[4])(pMVar4);
      quad::make_QuadRule((QuadRule *)local_368,(RefEl)(RefElType)iVar12,5);
      MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_binary_tests.cc:64:5)>
      ::operator()((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    *)&local_430,pMVar4,&EStack_360,(MatrixXd *)in_RCX);
      MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_binary_tests.cc:65:45)>
      ::operator()((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    *)local_4c8,
                   (MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:65:45)>
                    *)pMVar4,&EStack_360,(MatrixXd *)in_RCX);
      in_RCX = (string *)local_4c8;
      internal::OperatorAddition::operator()
                ((vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                  *)local_498,local_f8,
                 (vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)&local_430,
                 (vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)local_4c8,0);
      local_3f0 = puVar14;
      std::
      vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
      ::~vector((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                 *)local_4c8);
      std::
      vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
      ::~vector((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                 *)&local_430);
      MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_binary_tests.cc:104:7)>
      ::operator()((vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                    *)&local_430,
                   (MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:104:7)>
                    *)pMVar4,&EStack_360,(MatrixXd *)in_RCX);
      if (local_498._8_8_ != local_498._0_8_) {
        dVar28 = 0.0;
        pAVar20 = (AssertHelperData *)local_498._0_8_;
        do {
          local_478._0_8_ = (&pAVar20->file)[(long)dVar28 * 3];
          local_458.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.
          array[0] = 9.88131291682493e-324;
          testing::internal::CmpHelperEQ<long,long>
                    ((internal *)local_4c8,"vals1[i].rows()","vals2[i].rows()",(long *)local_478,
                     (long *)&local_458);
          if (local_4c8[0] == 0) {
            testing::Message::Message((Message *)local_478);
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                local_4c0._vptr_Entity ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              p_Var27 = (_func_int *)0x3c7fe6;
            }
            else {
              p_Var27 = *local_4c0._vptr_Entity;
            }
            in_RCX = (string *)0x27;
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_458,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_utils.h"
                       ,0x27,(char *)p_Var27);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_458,(Message *)local_478);
LAB_0011f9b3:
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_458);
            if ((long *)local_478._0_8_ != (long *)0x0) {
              (**(code **)(*(long *)local_478._0_8_ + 8))();
            }
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                local_4c0._vptr_Entity !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_4c0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_4c0._vptr_Entity);
            }
            if ((long *)local_430._M_dataplus._M_p != (long *)0x0) {
              operator_delete(local_430._M_dataplus._M_p,
                              CONCAT26(local_430.field_2._M_allocated_capacity._6_2_,
                                       CONCAT24(local_430.field_2._M_allocated_capacity._4_2_,
                                                local_430.field_2._M_allocated_capacity._0_4_)) -
                              (long)local_430._M_dataplus._M_p);
            }
            std::
            vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
            ::~vector((vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                       *)local_498);
            free(local_348);
            free(EStack_360._vptr_Entity);
            goto LAB_0011fa22;
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              local_4c0._vptr_Entity !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_4c0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_4c0._vptr_Entity);
          }
          local_478._0_8_ = *(undefined8 *)(local_498._0_8_ + (long)dVar28 * 0x18 + 0x10);
          local_458.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.
          array[0] = 4.94065645841247e-324;
          testing::internal::CmpHelperEQ<long,long>
                    ((internal *)local_4c8,"vals1[i].cols()","vals2[i].cols()",(long *)local_478,
                     (long *)&local_458);
          if (local_4c8[0] == 0) {
            testing::Message::Message((Message *)local_478);
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                local_4c0._vptr_Entity ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              p_Var27 = (_func_int *)0x3c7fe6;
            }
            else {
              p_Var27 = *local_4c0._vptr_Entity;
            }
            in_RCX = (string *)0x28;
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_458,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_utils.h"
                       ,0x28,(char *)p_Var27);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_458,(Message *)local_478);
            goto LAB_0011f9b3;
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              local_4c0._vptr_Entity !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_4c0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_4c0._vptr_Entity);
          }
          pAVar20 = (AssertHelperData *)local_498._0_8_;
          local_438 = dVar28;
          if (0 < *(long *)(local_498._0_8_ + (long)dVar28 * 0x18 + 8)) {
            lVar25 = 0;
            do {
              if (0 < *(Index *)((long)&pAVar20->line + (long)dVar28 * 3 * 8)) {
                this_00 = (DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                          ((((PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)
                            &pAVar20->type)->m_storage).m_data.array + (long)dVar28 * 3);
                lVar30 = 0;
                do {
                  pSVar17 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::
                            operator()(this_00,lVar25,lVar30);
                  local_3e8 = *pSVar17;
                  uStack_3e0 = 0;
                  pSVar16 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::
                            operator()((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)
                                       (local_430._M_dataplus._M_p + (long)dVar28 * 0x10),lVar25,
                                       lVar30);
                  local_478._0_8_ = ABS(local_3e8 - *pSVar16);
                  local_458.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
                  m_data.array[0] = (double)&DAT_3ddb7cdfd9d7bdbb;
                  testing::internal::CmpHelperLT<double,double>
                            ((internal *)local_4c8,"std::abs(vals1[i](r, c) - vals2[i](r, c))",
                             "1e-10",(double *)local_478,(double *)&local_458);
                  if (local_4c8[0] == 0) {
                    testing::Message::Message((Message *)local_478);
                    p_Var27 = (_func_int *)0x3c7fe6;
                    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_4c0._vptr_Entity !=
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      p_Var27 = *local_4c0._vptr_Entity;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&local_458,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_utils.h"
                               ,0x2b,(char *)p_Var27);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&local_458,(Message *)local_478);
                    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_458);
                    if ((long *)local_478._0_8_ != (long *)0x0) {
                      (**(code **)(*(long *)local_478._0_8_ + 8))();
                    }
                  }
                  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      local_4c0._vptr_Entity !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    std::
                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&local_4c0,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_4c0._vptr_Entity);
                  }
                  lVar30 = lVar30 + 1;
                  this_00 = (DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                            (local_498._0_8_ + (long)dVar28 * 0x18);
                  pAVar20 = (AssertHelperData *)local_498._0_8_;
                } while (lVar30 < *(long *)(this_00 + 0x10));
              }
              lVar25 = lVar25 + 1;
            } while (lVar25 < (long)(&pAVar20->file)[(long)dVar28 * 3]);
          }
          dVar28 = (double)((long)local_438 + 1);
          in_RCX = (string *)((local_498._8_8_ - (long)pAVar20 >> 3) * -0x5555555555555555);
        } while ((ulong)dVar28 <= in_RCX && (long)in_RCX - (long)dVar28 != 0);
      }
      if ((long *)local_430._M_dataplus._M_p != (long *)0x0) {
        operator_delete(local_430._M_dataplus._M_p,
                        CONCAT26(local_430.field_2._M_allocated_capacity._6_2_,
                                 CONCAT24(local_430.field_2._M_allocated_capacity._4_2_,
                                          local_430.field_2._M_allocated_capacity._0_4_)) -
                        (long)local_430._M_dataplus._M_p);
      }
      std::
      vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
      ::~vector((vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                 *)local_498);
      free(local_348);
      free(EStack_360._vptr_Entity);
      puVar14 = local_3f0 + 1;
    } while ((string *)puVar14 != local_3f8);
  }
LAB_0011fa22:
  local_118 = &PTR__MeshFunctionGlobal_0046f400;
  local_108 = &PTR__MeshFunctionGlobal_0046f430;
  auVar33 = (**(code **)(*(long *)local_3d8 + 0x10))(local_3d8,0);
  puVar14 = auVar33._0_8_;
  if (auVar33._8_8_ != 0) {
    in_RCX = (string *)(puVar14 + auVar33._8_8_);
    local_3f8 = in_RCX;
    do {
      pMVar5 = (MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:70:5)>
                *)*puVar14;
      local_3f0 = puVar14;
      iVar12 = (*pMVar5->_vptr_MeshFunctionGlobal[4])(pMVar5);
      quad::make_QuadRule((QuadRule *)local_368,(RefEl)(RefElType)iVar12,5);
      MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_binary_tests.cc:70:5)>
      ::operator()((vector<Eigen::Array<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Array<double,_2,_1,_0,_2,_1>_>_>
                    *)&local_430,pMVar5,&EStack_360,(MatrixXd *)in_RCX);
      MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_binary_tests.cc:72:24)>
      ::operator()((vector<Eigen::Array<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Array<double,_2,_1,_0,_2,_1>_>_>
                    *)local_4c8,
                   (MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:72:24)>
                    *)pMVar5,&EStack_360,(MatrixXd *)in_RCX);
      in_RCX = (string *)local_4c8;
      internal::OperatorAddition::operator()
                ((vector<Eigen::Array<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Array<double,_2,_1,_0,_2,_1>_>_>
                  *)local_498,local_120,
                 (vector<Eigen::Array<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Array<double,_2,_1,_0,_2,_1>_>_>
                  *)&local_430,
                 (vector<Eigen::Array<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Array<double,_2,_1,_0,_2,_1>_>_>
                  *)local_4c8,0);
      pvVar7 = (void *)CONCAT71(local_4c8._1_7_,local_4c8[0]);
      if (pvVar7 != (void *)0x0) {
        operator_delete(pvVar7,local_4b8._M_allocated_capacity - (long)pvVar7);
      }
      if ((long *)local_430._M_dataplus._M_p != (long *)0x0) {
        operator_delete(local_430._M_dataplus._M_p,
                        CONCAT26(local_430.field_2._M_allocated_capacity._6_2_,
                                 CONCAT24(local_430.field_2._M_allocated_capacity._4_2_,
                                          local_430.field_2._M_allocated_capacity._0_4_)) -
                        (long)local_430._M_dataplus._M_p);
      }
      MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_binary_tests.cc:104:7)>
      ::operator()((vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                    *)&local_430,
                   (MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:104:7)>
                    *)pMVar5,&EStack_360,(MatrixXd *)in_RCX);
      if (local_498._8_8_ != local_498._0_8_) {
        dVar28 = 0.0;
        do {
          local_478._0_8_ = (long *)0x2;
          local_458.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.
          array[0] = 9.88131291682493e-324;
          testing::internal::CmpHelperEQ<long,long>
                    ((internal *)local_4c8,"vals1[i].rows()","vals2[i].rows()",(long *)local_478,
                     (long *)&local_458);
          if (local_4c8[0] == 0) {
            testing::Message::Message((Message *)local_478);
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                local_4c0._vptr_Entity ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              p_Var27 = (_func_int *)0x3c7fe6;
            }
            else {
              p_Var27 = *local_4c0._vptr_Entity;
            }
            in_RCX = (string *)0x27;
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_458,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_utils.h"
                       ,0x27,(char *)p_Var27);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_458,(Message *)local_478);
LAB_0011fe19:
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_458);
            if ((long *)local_478._0_8_ != (long *)0x0) {
              (**(code **)(*(long *)local_478._0_8_ + 8))();
            }
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                local_4c0._vptr_Entity !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_4c0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_4c0._vptr_Entity);
            }
            if ((long *)local_430._M_dataplus._M_p != (long *)0x0) {
              operator_delete(local_430._M_dataplus._M_p,
                              CONCAT26(local_430.field_2._M_allocated_capacity._6_2_,
                                       CONCAT24(local_430.field_2._M_allocated_capacity._4_2_,
                                                local_430.field_2._M_allocated_capacity._0_4_)) -
                              (long)local_430._M_dataplus._M_p);
            }
            if ((AssertHelperData *)local_498._0_8_ != (AssertHelperData *)0x0) {
              operator_delete((void *)local_498._0_8_,local_488._0_8_ - local_498._0_8_);
            }
            free(local_348);
            free(EStack_360._vptr_Entity);
            goto LAB_0011fe95;
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              local_4c0._vptr_Entity !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_4c0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_4c0._vptr_Entity);
          }
          local_478._0_8_ = (long *)0x1;
          local_458.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.
          array[0] = 4.94065645841247e-324;
          testing::internal::CmpHelperEQ<long,long>
                    ((internal *)local_4c8,"vals1[i].cols()","vals2[i].cols()",(long *)local_478,
                     (long *)&local_458);
          if (local_4c8[0] == 0) {
            testing::Message::Message((Message *)local_478);
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                local_4c0._vptr_Entity ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              p_Var27 = (_func_int *)0x3c7fe6;
            }
            else {
              p_Var27 = *local_4c0._vptr_Entity;
            }
            in_RCX = (string *)0x28;
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_458,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_utils.h"
                       ,0x28,(char *)p_Var27);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_458,(Message *)local_478);
            goto LAB_0011fe19;
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              local_4c0._vptr_Entity !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_4c0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_4c0._vptr_Entity);
          }
          IVar29 = 0;
          bVar8 = true;
          local_438 = dVar28;
          do {
            bVar31 = bVar8;
            pSVar18 = Eigen::DenseCoeffsBase<Eigen::Array<double,_2,_1,_0,_2,_1>,_1>::operator()
                                ((DenseCoeffsBase<Eigen::Array<double,_2,_1,_0,_2,_1>,_1> *)
                                 (local_498._0_8_ + (long)dVar28 * 0x10),IVar29,0);
            local_3e8 = *pSVar18;
            uStack_3e0 = 0;
            pSVar16 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::operator()
                                ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)
                                 (local_430._M_dataplus._M_p + (long)dVar28 * 0x10),IVar29,0);
            local_478._0_8_ = ABS(local_3e8 - *pSVar16);
            local_458.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.
            array[0] = (double)&DAT_3ddb7cdfd9d7bdbb;
            in_RCX = (string *)local_478;
            testing::internal::CmpHelperLT<double,double>
                      ((internal *)local_4c8,"std::abs(vals1[i](r, c) - vals2[i](r, c))","1e-10",
                       (double *)local_478,(double *)&local_458);
            if (local_4c8[0] == 0) {
              testing::Message::Message((Message *)local_478);
              p_Var27 = (_func_int *)0x3c7fe6;
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_4c0._vptr_Entity !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                p_Var27 = *local_4c0._vptr_Entity;
              }
              in_RCX = (string *)0x2b;
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_458,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_utils.h"
                         ,0x2b,(char *)p_Var27);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_458,(Message *)local_478);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_458);
              if ((long *)local_478._0_8_ != (long *)0x0) {
                (**(code **)(*(long *)local_478._0_8_ + 8))();
              }
            }
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                local_4c0._vptr_Entity !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_4c0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_4c0._vptr_Entity);
            }
            IVar29 = 1;
            bVar8 = false;
          } while (bVar31);
          dVar28 = (double)((long)local_438 + 1);
        } while ((ulong)dVar28 < (ulong)((long)(local_498._8_8_ - local_498._0_8_) >> 4));
      }
      if ((long *)local_430._M_dataplus._M_p != (long *)0x0) {
        operator_delete(local_430._M_dataplus._M_p,
                        CONCAT26(local_430.field_2._M_allocated_capacity._6_2_,
                                 CONCAT24(local_430.field_2._M_allocated_capacity._4_2_,
                                          local_430.field_2._M_allocated_capacity._0_4_)) -
                        (long)local_430._M_dataplus._M_p);
      }
      if ((AssertHelperData *)local_498._0_8_ != (AssertHelperData *)0x0) {
        operator_delete((void *)local_498._0_8_,local_488._0_8_ - local_498._0_8_);
      }
      free(local_348);
      free(EStack_360._vptr_Entity);
      puVar14 = local_3f0 + 1;
    } while ((string *)puVar14 != local_3f8);
  }
LAB_0011fe95:
  local_140 = &PTR__MeshFunctionGlobal_0046f460;
  local_130 = &PTR__MeshFunctionGlobal_0046f430;
  auVar33 = (**(code **)(*(long *)local_3d8 + 0x10))(local_3d8,0);
  puVar14 = auVar33._0_8_;
  if (auVar33._8_8_ != 0) {
    in_RCX = (string *)(puVar14 + auVar33._8_8_);
    local_3f8 = in_RCX;
    do {
      pMVar6 = (MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:76:5)>
                *)*puVar14;
      local_3f0 = puVar14;
      iVar12 = (*pMVar6->_vptr_MeshFunctionGlobal[4])(pMVar6);
      quad::make_QuadRule((QuadRule *)local_368,(RefEl)(RefElType)iVar12,5);
      MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_binary_tests.cc:76:5)>
      ::operator()((vector<Eigen::Array<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Array<double,__1,_1,_0,__1,_1>_>_>
                    *)&local_430,pMVar6,&EStack_360,(MatrixXd *)in_RCX);
      MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_binary_tests.cc:72:24)>
      ::operator()((vector<Eigen::Array<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Array<double,_2,_1,_0,_2,_1>_>_>
                    *)local_4c8,
                   (MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:72:24)>
                    *)pMVar6,&EStack_360,(MatrixXd *)in_RCX);
      in_RCX = (string *)local_4c8;
      internal::OperatorAddition::operator()
                ((vector<Eigen::Array<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Array<double,_2,_1,_0,_2,_1>_>_>
                  *)local_498,local_148,
                 (vector<Eigen::Array<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Array<double,__1,_1,_0,__1,_1>_>_>
                  *)&local_430,
                 (vector<Eigen::Array<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Array<double,_2,_1,_0,_2,_1>_>_>
                  *)local_4c8,0);
      pvVar7 = (void *)CONCAT71(local_4c8._1_7_,local_4c8[0]);
      if (pvVar7 != (void *)0x0) {
        operator_delete(pvVar7,local_4b8._M_allocated_capacity - (long)pvVar7);
      }
      std::
      vector<Eigen::Array<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Array<double,_-1,_1,_0,_-1,_1>_>_>
      ::~vector((vector<Eigen::Array<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Array<double,__1,_1,_0,__1,_1>_>_>
                 *)&local_430);
      MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_binary_tests.cc:104:7)>
      ::operator()((vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                    *)&local_430,
                   (MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:104:7)>
                    *)pMVar6,&EStack_360,(MatrixXd *)in_RCX);
      if (local_498._8_8_ != local_498._0_8_) {
        dVar28 = 0.0;
        do {
          local_478._0_8_ = (long *)0x2;
          local_458.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.
          array[0] = 9.88131291682493e-324;
          testing::internal::CmpHelperEQ<long,long>
                    ((internal *)local_4c8,"vals1[i].rows()","vals2[i].rows()",(long *)local_478,
                     (long *)&local_458);
          if (local_4c8[0] == 0) {
            testing::Message::Message((Message *)local_478);
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                local_4c0._vptr_Entity ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              p_Var27 = (_func_int *)0x3c7fe6;
            }
            else {
              p_Var27 = *local_4c0._vptr_Entity;
            }
            in_RCX = (string *)0x27;
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_458,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_utils.h"
                       ,0x27,(char *)p_Var27);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_458,(Message *)local_478);
LAB_0012027b:
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_458);
            if ((long *)local_478._0_8_ != (long *)0x0) {
              (**(code **)(*(long *)local_478._0_8_ + 8))();
            }
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                local_4c0._vptr_Entity !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_4c0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_4c0._vptr_Entity);
            }
            if ((long *)local_430._M_dataplus._M_p != (long *)0x0) {
              operator_delete(local_430._M_dataplus._M_p,
                              CONCAT26(local_430.field_2._M_allocated_capacity._6_2_,
                                       CONCAT24(local_430.field_2._M_allocated_capacity._4_2_,
                                                local_430.field_2._M_allocated_capacity._0_4_)) -
                              (long)local_430._M_dataplus._M_p);
            }
            if ((AssertHelperData *)local_498._0_8_ != (AssertHelperData *)0x0) {
              operator_delete((void *)local_498._0_8_,local_488._0_8_ - local_498._0_8_);
            }
            free(local_348);
            free(EStack_360._vptr_Entity);
            goto LAB_001202f7;
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              local_4c0._vptr_Entity !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_4c0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_4c0._vptr_Entity);
          }
          local_478._0_8_ = (long *)0x1;
          local_458.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.
          array[0] = 4.94065645841247e-324;
          testing::internal::CmpHelperEQ<long,long>
                    ((internal *)local_4c8,"vals1[i].cols()","vals2[i].cols()",(long *)local_478,
                     (long *)&local_458);
          if (local_4c8[0] == 0) {
            testing::Message::Message((Message *)local_478);
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                local_4c0._vptr_Entity ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              p_Var27 = (_func_int *)0x3c7fe6;
            }
            else {
              p_Var27 = *local_4c0._vptr_Entity;
            }
            in_RCX = (string *)0x28;
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_458,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_utils.h"
                       ,0x28,(char *)p_Var27);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_458,(Message *)local_478);
            goto LAB_0012027b;
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              local_4c0._vptr_Entity !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_4c0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_4c0._vptr_Entity);
          }
          IVar29 = 0;
          bVar8 = true;
          local_438 = dVar28;
          do {
            bVar31 = bVar8;
            pSVar18 = Eigen::DenseCoeffsBase<Eigen::Array<double,_2,_1,_0,_2,_1>,_1>::operator()
                                ((DenseCoeffsBase<Eigen::Array<double,_2,_1,_0,_2,_1>,_1> *)
                                 (local_498._0_8_ + (long)dVar28 * 0x10),IVar29,0);
            local_3e8 = *pSVar18;
            uStack_3e0 = 0;
            pSVar16 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::operator()
                                ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)
                                 (local_430._M_dataplus._M_p + (long)dVar28 * 0x10),IVar29,0);
            local_478._0_8_ = ABS(local_3e8 - *pSVar16);
            local_458.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.
            array[0] = (double)&DAT_3ddb7cdfd9d7bdbb;
            in_RCX = (string *)local_478;
            testing::internal::CmpHelperLT<double,double>
                      ((internal *)local_4c8,"std::abs(vals1[i](r, c) - vals2[i](r, c))","1e-10",
                       (double *)local_478,(double *)&local_458);
            if (local_4c8[0] == 0) {
              testing::Message::Message((Message *)local_478);
              p_Var27 = (_func_int *)0x3c7fe6;
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_4c0._vptr_Entity !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                p_Var27 = *local_4c0._vptr_Entity;
              }
              in_RCX = (string *)0x2b;
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_458,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_utils.h"
                         ,0x2b,(char *)p_Var27);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_458,(Message *)local_478);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_458);
              if ((long *)local_478._0_8_ != (long *)0x0) {
                (**(code **)(*(long *)local_478._0_8_ + 8))();
              }
            }
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                local_4c0._vptr_Entity !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_4c0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_4c0._vptr_Entity);
            }
            IVar29 = 1;
            bVar8 = false;
          } while (bVar31);
          dVar28 = (double)((long)local_438 + 1);
        } while ((ulong)dVar28 < (ulong)((long)(local_498._8_8_ - local_498._0_8_) >> 4));
      }
      if ((long *)local_430._M_dataplus._M_p != (long *)0x0) {
        operator_delete(local_430._M_dataplus._M_p,
                        CONCAT26(local_430.field_2._M_allocated_capacity._6_2_,
                                 CONCAT24(local_430.field_2._M_allocated_capacity._4_2_,
                                          local_430.field_2._M_allocated_capacity._0_4_)) -
                        (long)local_430._M_dataplus._M_p);
      }
      if ((AssertHelperData *)local_498._0_8_ != (AssertHelperData *)0x0) {
        operator_delete((void *)local_498._0_8_,local_488._0_8_ - local_498._0_8_);
      }
      free(local_348);
      free(EStack_360._vptr_Entity);
      puVar14 = local_3f0 + 1;
    } while ((string *)puVar14 != local_3f8);
  }
LAB_001202f7:
  local_168 = &PTR__MeshFunctionGlobal_0046f400;
  local_158 = &PTR__MeshFunctionGlobal_0046f490;
  auVar33 = (**(code **)(*(long *)local_3d8 + 0x10))(local_3d8,0);
  puVar14 = auVar33._0_8_;
  if (auVar33._8_8_ != 0) {
    in_RCX = (string *)(puVar14 + auVar33._8_8_);
    local_3f8 = in_RCX;
    do {
      pMVar5 = (MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:70:5)>
                *)*puVar14;
      local_3f0 = puVar14;
      iVar12 = (*pMVar5->_vptr_MeshFunctionGlobal[4])(pMVar5);
      quad::make_QuadRule((QuadRule *)local_368,(RefEl)(RefElType)iVar12,5);
      MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_binary_tests.cc:70:5)>
      ::operator()((vector<Eigen::Array<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Array<double,_2,_1,_0,_2,_1>_>_>
                    *)&local_430,pMVar5,&EStack_360,(MatrixXd *)in_RCX);
      MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_binary_tests.cc:78:24)>
      ::operator()((vector<Eigen::Array<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Array<double,__1,_1,_0,__1,_1>_>_>
                    *)local_4c8,
                   (MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:78:24)>
                    *)pMVar5,&EStack_360,(MatrixXd *)in_RCX);
      in_RCX = (string *)local_4c8;
      internal::OperatorAddition::operator()
                ((vector<Eigen::Array<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Array<double,_2,_1,_0,_2,_1>_>_>
                  *)local_498,local_170,
                 (vector<Eigen::Array<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Array<double,_2,_1,_0,_2,_1>_>_>
                  *)&local_430,
                 (vector<Eigen::Array<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Array<double,__1,_1,_0,__1,_1>_>_>
                  *)local_4c8,0);
      std::
      vector<Eigen::Array<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Array<double,_-1,_1,_0,_-1,_1>_>_>
      ::~vector((vector<Eigen::Array<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Array<double,__1,_1,_0,__1,_1>_>_>
                 *)local_4c8);
      if ((long *)local_430._M_dataplus._M_p != (long *)0x0) {
        operator_delete(local_430._M_dataplus._M_p,
                        CONCAT26(local_430.field_2._M_allocated_capacity._6_2_,
                                 CONCAT24(local_430.field_2._M_allocated_capacity._4_2_,
                                          local_430.field_2._M_allocated_capacity._0_4_)) -
                        (long)local_430._M_dataplus._M_p);
      }
      MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_binary_tests.cc:104:7)>
      ::operator()((vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                    *)&local_430,
                   (MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:104:7)>
                    *)pMVar5,&EStack_360,(MatrixXd *)in_RCX);
      if (local_498._8_8_ != local_498._0_8_) {
        dVar28 = 0.0;
        do {
          local_478._0_8_ = (long *)0x2;
          local_458.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.
          array[0] = 9.88131291682493e-324;
          testing::internal::CmpHelperEQ<long,long>
                    ((internal *)local_4c8,"vals1[i].rows()","vals2[i].rows()",(long *)local_478,
                     (long *)&local_458);
          if (local_4c8[0] == 0) {
            testing::Message::Message((Message *)local_478);
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                local_4c0._vptr_Entity ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              p_Var27 = (_func_int *)0x3c7fe6;
            }
            else {
              p_Var27 = *local_4c0._vptr_Entity;
            }
            in_RCX = (string *)0x27;
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_458,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_utils.h"
                       ,0x27,(char *)p_Var27);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_458,(Message *)local_478);
LAB_001206e0:
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_458);
            if ((long *)local_478._0_8_ != (long *)0x0) {
              (**(code **)(*(long *)local_478._0_8_ + 8))();
            }
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                local_4c0._vptr_Entity !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_4c0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_4c0._vptr_Entity);
            }
            if ((long *)local_430._M_dataplus._M_p != (long *)0x0) {
              operator_delete(local_430._M_dataplus._M_p,
                              CONCAT26(local_430.field_2._M_allocated_capacity._6_2_,
                                       CONCAT24(local_430.field_2._M_allocated_capacity._4_2_,
                                                local_430.field_2._M_allocated_capacity._0_4_)) -
                              (long)local_430._M_dataplus._M_p);
            }
            if ((AssertHelperData *)local_498._0_8_ != (AssertHelperData *)0x0) {
              operator_delete((void *)local_498._0_8_,local_488._0_8_ - local_498._0_8_);
            }
            free(local_348);
            free(EStack_360._vptr_Entity);
            goto LAB_0012075c;
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              local_4c0._vptr_Entity !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_4c0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_4c0._vptr_Entity);
          }
          local_478._0_8_ = (long *)0x1;
          local_458.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.
          array[0] = 4.94065645841247e-324;
          testing::internal::CmpHelperEQ<long,long>
                    ((internal *)local_4c8,"vals1[i].cols()","vals2[i].cols()",(long *)local_478,
                     (long *)&local_458);
          if (local_4c8[0] == 0) {
            testing::Message::Message((Message *)local_478);
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                local_4c0._vptr_Entity ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              p_Var27 = (_func_int *)0x3c7fe6;
            }
            else {
              p_Var27 = *local_4c0._vptr_Entity;
            }
            in_RCX = (string *)0x28;
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_458,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_utils.h"
                       ,0x28,(char *)p_Var27);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_458,(Message *)local_478);
            goto LAB_001206e0;
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              local_4c0._vptr_Entity !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_4c0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_4c0._vptr_Entity);
          }
          IVar29 = 0;
          bVar8 = true;
          local_438 = dVar28;
          do {
            bVar31 = bVar8;
            pSVar18 = Eigen::DenseCoeffsBase<Eigen::Array<double,_2,_1,_0,_2,_1>,_1>::operator()
                                ((DenseCoeffsBase<Eigen::Array<double,_2,_1,_0,_2,_1>,_1> *)
                                 (local_498._0_8_ + (long)dVar28 * 0x10),IVar29,0);
            local_3e8 = *pSVar18;
            uStack_3e0 = 0;
            pSVar16 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::operator()
                                ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)
                                 (local_430._M_dataplus._M_p + (long)dVar28 * 0x10),IVar29,0);
            local_478._0_8_ = ABS(local_3e8 - *pSVar16);
            local_458.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.
            array[0] = (double)&DAT_3ddb7cdfd9d7bdbb;
            in_RCX = (string *)local_478;
            testing::internal::CmpHelperLT<double,double>
                      ((internal *)local_4c8,"std::abs(vals1[i](r, c) - vals2[i](r, c))","1e-10",
                       (double *)local_478,(double *)&local_458);
            if (local_4c8[0] == 0) {
              testing::Message::Message((Message *)local_478);
              p_Var27 = (_func_int *)0x3c7fe6;
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_4c0._vptr_Entity !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                p_Var27 = *local_4c0._vptr_Entity;
              }
              in_RCX = (string *)0x2b;
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_458,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_utils.h"
                         ,0x2b,(char *)p_Var27);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_458,(Message *)local_478);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_458);
              if ((long *)local_478._0_8_ != (long *)0x0) {
                (**(code **)(*(long *)local_478._0_8_ + 8))();
              }
            }
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                local_4c0._vptr_Entity !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_4c0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_4c0._vptr_Entity);
            }
            IVar29 = 1;
            bVar8 = false;
          } while (bVar31);
          dVar28 = (double)((long)local_438 + 1);
        } while ((ulong)dVar28 < (ulong)((long)(local_498._8_8_ - local_498._0_8_) >> 4));
      }
      if ((long *)local_430._M_dataplus._M_p != (long *)0x0) {
        operator_delete(local_430._M_dataplus._M_p,
                        CONCAT26(local_430.field_2._M_allocated_capacity._6_2_,
                                 CONCAT24(local_430.field_2._M_allocated_capacity._4_2_,
                                          local_430.field_2._M_allocated_capacity._0_4_)) -
                        (long)local_430._M_dataplus._M_p);
      }
      if ((AssertHelperData *)local_498._0_8_ != (AssertHelperData *)0x0) {
        operator_delete((void *)local_498._0_8_,local_488._0_8_ - local_498._0_8_);
      }
      free(local_348);
      free(EStack_360._vptr_Entity);
      puVar14 = local_3f0 + 1;
    } while ((string *)puVar14 != local_3f8);
  }
LAB_0012075c:
  local_190 = &PTR__MeshFunctionGlobal_0046f460;
  local_180 = &PTR__MeshFunctionGlobal_0046f490;
  auVar33 = (**(code **)(*(long *)local_3d8 + 0x10))(local_3d8,0);
  puVar14 = auVar33._0_8_;
  if (auVar33._8_8_ != 0) {
    local_3f8 = (string *)(puVar14 + auVar33._8_8_);
    do {
      pMVar6 = (MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:76:5)>
                *)*puVar14;
      iVar12 = (*pMVar6->_vptr_MeshFunctionGlobal[4])(pMVar6);
      quad::make_QuadRule((QuadRule *)local_368,(RefEl)(RefElType)iVar12,5);
      MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_binary_tests.cc:76:5)>
      ::operator()((vector<Eigen::Array<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Array<double,__1,_1,_0,__1,_1>_>_>
                    *)&local_430,pMVar6,&EStack_360,(MatrixXd *)in_RCX);
      MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_binary_tests.cc:78:24)>
      ::operator()((vector<Eigen::Array<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Array<double,__1,_1,_0,__1,_1>_>_>
                    *)local_4c8,
                   (MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:78:24)>
                    *)pMVar6,&EStack_360,(MatrixXd *)in_RCX);
      in_RCX = (string *)local_4c8;
      internal::OperatorAddition::operator()
                ((vector<Eigen::Array<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Array<double,__1,__1,_0,__1,__1>_>_>
                  *)local_498,local_198,
                 (vector<Eigen::Array<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Array<double,__1,_1,_0,__1,_1>_>_>
                  *)&local_430,
                 (vector<Eigen::Array<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Array<double,__1,_1,_0,__1,_1>_>_>
                  *)local_4c8,0);
      local_3f0 = puVar14;
      std::
      vector<Eigen::Array<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Array<double,_-1,_1,_0,_-1,_1>_>_>
      ::~vector((vector<Eigen::Array<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Array<double,__1,_1,_0,__1,_1>_>_>
                 *)local_4c8);
      std::
      vector<Eigen::Array<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Array<double,_-1,_1,_0,_-1,_1>_>_>
      ::~vector((vector<Eigen::Array<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Array<double,__1,_1,_0,__1,_1>_>_>
                 *)&local_430);
      MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_binary_tests.cc:104:7)>
      ::operator()((vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                    *)&local_430,
                   (MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:104:7)>
                    *)pMVar6,&EStack_360,(MatrixXd *)in_RCX);
      if (local_498._8_8_ != local_498._0_8_) {
        dVar28 = 0.0;
        pAVar20 = (AssertHelperData *)local_498._0_8_;
        do {
          local_478._0_8_ = (&pAVar20->file)[(long)dVar28 * 3];
          local_458.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.
          array[0] = 9.88131291682493e-324;
          testing::internal::CmpHelperEQ<long,long>
                    ((internal *)local_4c8,"vals1[i].rows()","vals2[i].rows()",(long *)local_478,
                     (long *)&local_458);
          if (local_4c8[0] == 0) {
            testing::Message::Message((Message *)local_478);
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                local_4c0._vptr_Entity ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              p_Var27 = (_func_int *)0x3c7fe6;
            }
            else {
              p_Var27 = *local_4c0._vptr_Entity;
            }
            in_RCX = (string *)0x27;
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_458,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_utils.h"
                       ,0x27,(char *)p_Var27);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_458,(Message *)local_478);
LAB_00120b6b:
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_458);
            if ((long *)local_478._0_8_ != (long *)0x0) {
              (**(code **)(*(long *)local_478._0_8_ + 8))();
            }
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                local_4c0._vptr_Entity !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_4c0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_4c0._vptr_Entity);
            }
            if ((long *)local_430._M_dataplus._M_p != (long *)0x0) {
              operator_delete(local_430._M_dataplus._M_p,
                              CONCAT26(local_430.field_2._M_allocated_capacity._6_2_,
                                       CONCAT24(local_430.field_2._M_allocated_capacity._4_2_,
                                                local_430.field_2._M_allocated_capacity._0_4_)) -
                              (long)local_430._M_dataplus._M_p);
            }
            std::
            vector<Eigen::Array<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Array<double,_-1,_-1,_0,_-1,_-1>_>_>
            ::~vector((vector<Eigen::Array<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Array<double,__1,__1,_0,__1,__1>_>_>
                       *)local_498);
            free(local_348);
            free(EStack_360._vptr_Entity);
            goto LAB_00120bda;
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              local_4c0._vptr_Entity !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_4c0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_4c0._vptr_Entity);
          }
          local_478._0_8_ = *(undefined8 *)(local_498._0_8_ + (long)dVar28 * 0x18 + 0x10);
          local_458.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.
          array[0] = 4.94065645841247e-324;
          testing::internal::CmpHelperEQ<long,long>
                    ((internal *)local_4c8,"vals1[i].cols()","vals2[i].cols()",(long *)local_478,
                     (long *)&local_458);
          if (local_4c8[0] == 0) {
            testing::Message::Message((Message *)local_478);
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                local_4c0._vptr_Entity ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              p_Var27 = (_func_int *)0x3c7fe6;
            }
            else {
              p_Var27 = *local_4c0._vptr_Entity;
            }
            in_RCX = (string *)0x28;
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_458,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_utils.h"
                       ,0x28,(char *)p_Var27);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_458,(Message *)local_478);
            goto LAB_00120b6b;
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              local_4c0._vptr_Entity !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_4c0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_4c0._vptr_Entity);
          }
          pAVar20 = (AssertHelperData *)local_498._0_8_;
          local_438 = dVar28;
          if (0 < *(long *)(local_498._0_8_ + (long)dVar28 * 0x18 + 8)) {
            lVar25 = 0;
            do {
              if (0 < *(Index *)((long)&pAVar20->line + (long)dVar28 * 3 * 8)) {
                this_01 = (DenseCoeffsBase<Eigen::Array<double,__1,__1,_0,__1,__1>,_1> *)
                          ((((PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)
                            &pAVar20->type)->m_storage).m_data.array + (long)dVar28 * 3);
                lVar30 = 0;
                do {
                  pSVar19 = Eigen::DenseCoeffsBase<Eigen::Array<double,_-1,_-1,_0,_-1,_-1>,_1>::
                            operator()(this_01,lVar25,lVar30);
                  local_3e8 = *pSVar19;
                  uStack_3e0 = 0;
                  pSVar16 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::
                            operator()((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)
                                       (local_430._M_dataplus._M_p + (long)dVar28 * 0x10),lVar25,
                                       lVar30);
                  local_478._0_8_ = ABS(local_3e8 - *pSVar16);
                  local_458.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
                  m_data.array[0] = (double)&DAT_3ddb7cdfd9d7bdbb;
                  testing::internal::CmpHelperLT<double,double>
                            ((internal *)local_4c8,"std::abs(vals1[i](r, c) - vals2[i](r, c))",
                             "1e-10",(double *)local_478,(double *)&local_458);
                  if (local_4c8[0] == 0) {
                    testing::Message::Message((Message *)local_478);
                    p_Var27 = (_func_int *)0x3c7fe6;
                    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_4c0._vptr_Entity !=
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      p_Var27 = *local_4c0._vptr_Entity;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&local_458,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_utils.h"
                               ,0x2b,(char *)p_Var27);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&local_458,(Message *)local_478);
                    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_458);
                    if ((long *)local_478._0_8_ != (long *)0x0) {
                      (**(code **)(*(long *)local_478._0_8_ + 8))();
                    }
                  }
                  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      local_4c0._vptr_Entity !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    std::
                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&local_4c0,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_4c0._vptr_Entity);
                  }
                  lVar30 = lVar30 + 1;
                  this_01 = (DenseCoeffsBase<Eigen::Array<double,__1,__1,_0,__1,__1>,_1> *)
                            (local_498._0_8_ + (long)dVar28 * 0x18);
                  pAVar20 = (AssertHelperData *)local_498._0_8_;
                } while (lVar30 < *(long *)(this_01 + 0x10));
              }
              lVar25 = lVar25 + 1;
            } while (lVar25 < (long)(&pAVar20->file)[(long)dVar28 * 3]);
          }
          dVar28 = (double)((long)local_438 + 1);
          in_RCX = (string *)((local_498._8_8_ - (long)pAVar20 >> 3) * -0x5555555555555555);
        } while ((ulong)dVar28 <= in_RCX && (long)in_RCX - (long)dVar28 != 0);
      }
      if ((long *)local_430._M_dataplus._M_p != (long *)0x0) {
        operator_delete(local_430._M_dataplus._M_p,
                        CONCAT26(local_430.field_2._M_allocated_capacity._6_2_,
                                 CONCAT24(local_430.field_2._M_allocated_capacity._4_2_,
                                          local_430.field_2._M_allocated_capacity._0_4_)) -
                        (long)local_430._M_dataplus._M_p);
      }
      std::
      vector<Eigen::Array<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Array<double,_-1,_-1,_0,_-1,_-1>_>_>
      ::~vector((vector<Eigen::Array<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Array<double,__1,__1,_0,__1,__1>_>_>
                 *)local_498);
      free(local_348);
      free(EStack_360._vptr_Entity);
      puVar14 = local_3f0 + 1;
    } while ((string *)puVar14 != local_3f8);
  }
LAB_00120bda:
  local_1b8 = &PTR__MeshFunctionGlobal_0046f2e0;
  local_1a8 = &PTR__MeshFunctionGlobal_0046f310;
  auVar33 = (**(code **)(*(long *)local_3d8 + 0x10))(local_3d8,0);
  psVar13 = auVar33._0_8_;
  if (auVar33._8_8_ != 0) {
    local_388 = (string *)(&psVar13->_M_dataplus + auVar33._8_8_);
    do {
      _Var2._M_head_impl =
           (((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              *)&(psVar13->_M_dataplus)._M_p)->
           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
      RVar9.type_ = (**(code **)(*(long *)_Var2._M_head_impl + 0x20))(_Var2._M_head_impl);
      quad::make_QuadRule((QuadRule *)local_4c8,RVar9,5);
      MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_binary_tests.cc:83:24)>
      ::operator()((vector<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
                    *)local_368,
                   (MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:83:24)>
                    *)_Var2._M_head_impl,&local_4c0,(MatrixXd *)in_RCX);
      MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_binary_tests.cc:84:37)>
      ::operator()((vector<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
                    *)&local_430,
                   (MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:84:37)>
                    *)_Var2._M_head_impl,&local_4c0,(MatrixXd *)in_RCX);
      internal::OperatorAddition::operator()
                (&local_380,local_1c0,
                 (vector<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
                  *)local_368,
                 (vector<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
                  *)&local_430,0);
      if ((long *)local_430._M_dataplus._M_p != (long *)0x0) {
        operator_delete(local_430._M_dataplus._M_p,
                        CONCAT26(local_430.field_2._M_allocated_capacity._6_2_,
                                 CONCAT24(local_430.field_2._M_allocated_capacity._4_2_,
                                          local_430.field_2._M_allocated_capacity._0_4_)) -
                        (long)local_430._M_dataplus._M_p);
      }
      if (local_368 != (undefined1  [8])0x0) {
        operator_delete((void *)local_368,local_358 - (long)local_368);
      }
      RVar10 = (**(code **)(*(long *)_Var2._M_head_impl + 0x20))(_Var2._M_head_impl);
      dVar11 = base::internal::DimensionImpl(RVar10);
      if ((pointer)local_4b8._M_allocated_capacity != (pointer)(ulong)dVar11) {
        std::__cxx11::stringstream::stringstream((stringstream *)local_368);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_358,"mismatch between entity dimension and local.rows()",0x32);
        paVar1 = &local_430.field_2;
        local_430._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_430,"e.RefEl().Dimension() == local.rows()","");
        pAVar20 = (AssertHelperData *)(local_498 + 0x10);
        local_498._0_8_ = pAVar20;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_498,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/mesh_function_global.h"
                   ,"");
        std::__cxx11::stringbuf::str();
        base::AssertionFailed(&local_430,(string *)local_498,0x50,(string *)local_478);
        if ((undefined1 *)local_478._0_8_ != local_478 + 0x10) {
          operator_delete((void *)local_478._0_8_,CONCAT71(local_478._17_7_,local_478[0x10]) + 1);
        }
        if ((AssertHelperData *)local_498._0_8_ != pAVar20) {
          operator_delete((void *)local_498._0_8_,(ulong)(local_488._0_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_430._M_dataplus._M_p != paVar1) {
          operator_delete(local_430._M_dataplus._M_p,
                          CONCAT26(local_430.field_2._M_allocated_capacity._6_2_,
                                   CONCAT24(local_430.field_2._M_allocated_capacity._4_2_,
                                            local_430.field_2._M_allocated_capacity._0_4_)) + 1);
        }
        local_430.field_2._M_allocated_capacity._0_4_ = 0x736c6166;
        local_430.field_2._M_allocated_capacity._4_2_ = 0x65;
        local_430._M_string_length = 5;
        local_498._0_8_ = pAVar20;
        local_430._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_498,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/mesh_function_global.h"
                   ,"");
        local_478._8_8_ = 0;
        local_478[0x10] = '\0';
        local_478._0_8_ = local_478 + 0x10;
        base::AssertionFailed(&local_430,(string *)local_498,0x50,(string *)local_478);
LAB_00121569:
        std::__cxx11::string::~string((string *)local_478);
        std::__cxx11::string::~string((string *)local_498);
        std::__cxx11::string::~string((string *)&local_430);
        abort();
      }
      local_3a8.
      super__Vector_base<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_3a8.
      super__Vector_base<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (Matrix<double,_2,_2,_0,_2,_2> *)0x0;
      local_3a8.
      super__Vector_base<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (Matrix<double,_2,_2,_0,_2,_2> *)0x0;
      std::
      vector<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
      ::reserve(&local_3a8,local_4b8._8_8_);
      local_3f8 = psVar13;
      puVar14 = (undefined8 *)(**(code **)(*(long *)_Var2._M_head_impl + 0x18))(_Var2._M_head_impl);
      in_RCX = (string *)*puVar14;
      (**(code **)((long)&in_RCX->field_2 + 8))(&local_3c8,puVar14,&local_4c0);
      if (0 < (long)local_4b8._8_8_) {
        IVar29 = 0;
        do {
          Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
                    ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)&local_430,
                     &local_3c8,IVar29);
          local_338 = local_400;
          local_358 = CONCAT26(local_430.field_2._M_allocated_capacity._6_2_,
                               CONCAT24(local_430.field_2._M_allocated_capacity._4_2_,
                                        local_430.field_2._M_allocated_capacity._0_4_));
          local_348 = local_410;
          IStack_340 = IStack_408;
          IStack_350 = local_430.field_2._8_8_;
          local_368 = (undefined1  [8])local_430._M_dataplus._M_p;
          EStack_360._vptr_Entity = (_func_int **)local_430._M_string_length;
          pSVar15 = Eigen::
                    DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_1>
                    ::operator[]((DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
                                  *)local_368,0);
          local_3e8 = *pSVar15;
          pSVar15 = Eigen::
                    DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_1>
                    ::operator[]((DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
                                  *)local_368,0);
          local_478._0_8_ = local_3e8 * *pSVar15;
          local_498._0_8_ = local_478;
          local_498._8_8_ = (AssertHelperData *)0x0;
          local_488._0_8_ = (pointer)0x1;
          local_488._8_8_ = 1;
          pSVar15 = Eigen::
                    DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_1>
                    ::operator[]((DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
                                  *)local_368,0);
          local_3e8 = *pSVar15;
          pSVar15 = Eigen::
                    DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_1>
                    ::operator[]((DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
                                  *)local_368,1);
          local_1c8 = local_3e8 * *pSVar15 + 1.0;
          pCVar21 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::operator_
                              ((CommaInitializer<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)local_498,
                               &local_1c8);
          pSVar15 = Eigen::
                    DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_1>
                    ::operator[]((DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
                                  *)local_368,0);
          local_3e8 = *pSVar15;
          pSVar15 = Eigen::
                    DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_1>
                    ::operator[]((DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
                                  *)local_368,1);
          local_438 = *pSVar15;
          pSVar15 = Eigen::
                    DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_1>
                    ::operator[]((DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
                                  *)local_368,0);
          local_1d0 = local_3e8 * local_438 + *pSVar15;
          pCVar21 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::operator_
                              (pCVar21,&local_1d0);
          pSVar15 = Eigen::
                    DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_1>
                    ::operator[]((DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
                                  *)local_368,1);
          local_3e8 = *pSVar15;
          pSVar15 = Eigen::
                    DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_1>
                    ::operator[]((DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
                                  *)local_368,1);
          local_438 = *pSVar15;
          pSVar15 = Eigen::
                    DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_1>
                    ::operator[]((DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
                                  *)local_368,1);
          local_1d8 = local_3e8 * local_438 + *pSVar15;
          pCVar21 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::operator_
                              (pCVar21,&local_1d8);
          pMVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::finished
                              (pCVar21);
          local_458.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.
          array[0] = (pMVar22->super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>).
                     m_storage.m_data.array[0];
          local_458.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.
          array[1] = (pMVar22->super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>).
                     m_storage.m_data.array[1];
          local_458.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.
          array[2] = (pMVar22->super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>).
                     m_storage.m_data.array[2];
          local_458.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.
          array[3] = (pMVar22->super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>).
                     m_storage.m_data.array[3];
          Eigen::CommaInitializer<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::finished
                    ((CommaInitializer<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)local_498);
          if (local_3a8.
              super__Vector_base<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              local_3a8.
              super__Vector_base<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<Eigen::Matrix<double,2,2,0,2,2>,std::allocator<Eigen::Matrix<double,2,2,0,2,2>>>
            ::_M_realloc_insert<Eigen::Matrix<double,2,2,0,2,2>>
                      ((vector<Eigen::Matrix<double,2,2,0,2,2>,std::allocator<Eigen::Matrix<double,2,2,0,2,2>>>
                        *)&local_3a8,
                       (iterator)
                       local_3a8.
                       super__Vector_base<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,&local_458);
          }
          else {
            ((local_3a8.
              super__Vector_base<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
              ._M_impl.super__Vector_impl_data._M_finish)->
            super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>).m_storage.m_data.array[2]
                 = local_458.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
                   m_data.array[2];
            ((local_3a8.
              super__Vector_base<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
              ._M_impl.super__Vector_impl_data._M_finish)->
            super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>).m_storage.m_data.array[3]
                 = local_458.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
                   m_data.array[3];
            ((local_3a8.
              super__Vector_base<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
              ._M_impl.super__Vector_impl_data._M_finish)->
            super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>).m_storage.m_data.array[0]
                 = local_458.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
                   m_data.array[0];
            ((local_3a8.
              super__Vector_base<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
              ._M_impl.super__Vector_impl_data._M_finish)->
            super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>).m_storage.m_data.array[1]
                 = local_458.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
                   m_data.array[1];
            local_3a8.
            super__Vector_base<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_3a8.
                 super__Vector_base<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
          }
          IVar29 = IVar29 + 1;
        } while (IVar29 < (long)local_4b8._8_8_);
      }
      free(local_3c8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_data);
      if (local_380.
          super__Vector_base<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_380.
          super__Vector_base<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        local_438 = 0.0;
        do {
          local_430._M_dataplus._M_p = (pointer)0x2;
          local_498._0_8_ = (AssertHelperData *)0x2;
          testing::internal::CmpHelperEQ<long,long>
                    ((internal *)local_368,"vals1[i].rows()","vals2[i].rows()",(long *)&local_430,
                     (long *)local_498);
          if ((DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
               )local_368[0] ==
              (DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
               )0x0) {
            testing::Message::Message((Message *)&local_430);
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                EStack_360._vptr_Entity ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              p_Var27 = (_func_int *)0x3c7fe6;
            }
            else {
              p_Var27 = *EStack_360._vptr_Entity;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)local_498,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_utils.h"
                       ,0x27,(char *)p_Var27);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)local_498,(Message *)&local_430);
LAB_00121340:
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_498);
            if ((long *)local_430._M_dataplus._M_p != (long *)0x0) {
              (**(code **)(*(long *)local_430._M_dataplus._M_p + 8))();
            }
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                EStack_360._vptr_Entity !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&EStack_360,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           EStack_360._vptr_Entity);
            }
            if (local_3a8.
                super__Vector_base<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_3a8.
                              super__Vector_base<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_3a8.
                                    super__Vector_base<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_3a8.
                                    super__Vector_base<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            if (local_380.
                super__Vector_base<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_380.
                              super__Vector_base<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_380.
                                    super__Vector_base<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_380.
                                    super__Vector_base<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            free(local_4a8);
            free(local_4c0._vptr_Entity);
            goto LAB_001213c5;
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              EStack_360._vptr_Entity !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&EStack_360,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         EStack_360._vptr_Entity);
          }
          local_430._M_dataplus._M_p = (pointer)0x2;
          local_498._0_8_ = (AssertHelperData *)0x2;
          AVar34 = testing::internal::CmpHelperEQ<long,long>
                             ((internal *)local_368,"vals1[i].cols()","vals2[i].cols()",
                              (long *)&local_430,(long *)local_498);
          uVar24 = AVar34._0_8_;
          if ((DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
               )local_368[0] ==
              (DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
               )0x0) {
            testing::Message::Message((Message *)&local_430);
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                EStack_360._vptr_Entity ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              p_Var27 = (_func_int *)0x3c7fe6;
            }
            else {
              p_Var27 = *EStack_360._vptr_Entity;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)local_498,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_utils.h"
                       ,0x28,(char *)p_Var27);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)local_498,(Message *)&local_430);
            goto LAB_00121340;
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              EStack_360._vptr_Entity !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&EStack_360,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         EStack_360._vptr_Entity);
            uVar24 = extraout_RAX;
          }
          uVar24 = CONCAT71((int7)((ulong)uVar24 >> 8),1);
          IVar29 = 0;
          do {
            local_3f0 = (undefined8 *)CONCAT44(local_3f0._4_4_,(int)uVar24);
            col = 0;
            bVar8 = true;
            do {
              bVar31 = bVar8;
              dVar28 = local_438;
              pSVar23 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_1>::operator()
                                  ((DenseCoeffsBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_1> *)
                                   (local_380.
                                    super__Vector_base<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + (long)local_438),
                                   IVar29,col);
              local_3e8 = *pSVar23;
              uStack_3e0 = 0;
              pSVar23 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_1>::operator()
                                  ((DenseCoeffsBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_1> *)
                                   (local_3a8.
                                    super__Vector_base<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + (long)dVar28),IVar29
                                   ,col);
              local_430._M_dataplus._M_p = (pointer)ABS(local_3e8 - *pSVar23);
              local_498._0_8_ = &DAT_3ddb7cdfd9d7bdbb;
              in_RCX = &local_430;
              testing::internal::CmpHelperLT<double,double>
                        ((internal *)local_368,"std::abs(vals1[i](r, c) - vals2[i](r, c))","1e-10",
                         (double *)&local_430,(double *)local_498);
              if ((DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
                   )local_368[0] ==
                  (DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
                   )0x0) {
                testing::Message::Message((Message *)&local_430);
                p_Var27 = (_func_int *)0x3c7fe6;
                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    EStack_360._vptr_Entity !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  p_Var27 = *EStack_360._vptr_Entity;
                }
                in_RCX = (string *)0x2b;
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)local_498,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_utils.h"
                           ,0x2b,(char *)p_Var27);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)local_498,(Message *)&local_430);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_498);
                if ((long *)local_430._M_dataplus._M_p != (long *)0x0) {
                  (**(code **)(*(long *)local_430._M_dataplus._M_p + 8))();
                }
              }
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  EStack_360._vptr_Entity !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&EStack_360,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             EStack_360._vptr_Entity);
              }
              col = 1;
              bVar8 = false;
            } while (bVar31);
            IVar29 = 1;
            uVar24 = 0;
          } while (((ulong)local_3f0 & 1) != 0);
          local_438 = (double)((long)local_438 + 1);
        } while ((ulong)local_438 <
                 (ulong)((long)local_380.
                               super__Vector_base<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_380.
                               super__Vector_base<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 5));
      }
      if (local_3a8.
          super__Vector_base<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_3a8.
                        super__Vector_base<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_3a8.
                              super__Vector_base<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_3a8.
                              super__Vector_base<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      psVar13 = local_3f8;
      if (local_380.
          super__Vector_base<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_380.
                        super__Vector_base<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_380.
                              super__Vector_base<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_380.
                              super__Vector_base<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      free(local_4a8);
      free(local_4c0._vptr_Entity);
      psVar13 = (string *)&psVar13->_M_string_length;
    } while (psVar13 != local_388);
  }
LAB_001213c5:
  a.a_.value_.x_ = (X)0x0;
  a._0_4_ = mfXB;
  a.b_.value_.x_ = (X)0x3;
  checkMeshFunctionEqual<lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorAddition,lf::mesh::utils::MeshFunctionConstant<lf::mesh::utils::test::X>,lf::mesh::utils::MeshFunctionConstant<lf::mesh::utils::test::X>>,lf::mesh::utils::MeshFunctionConstant<lf::mesh::utils::test::X>>
            (local_3d8,(Mesh *)((ulong)mfXA << 0x20),a,
             (MeshFunctionConstant<lf::mesh::utils::test::X>)0x0,in_R9D);
  if (local_3d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3d0);
  }
  return;
}

Assistant:

TEST(meshFunctionBinary, Addition) {
  auto mesh = lf::mesh::test_utils::GenerateHybrid2DTestMesh(0);

  auto sum = mfA + mfB;
  checkMeshFunctionEqual(*mesh, sum, MeshFunctionGlobal([](auto x) {
    return x[0] * x[0] + 2 * x[1] + x[0];
  }));

  auto mfVecAdd = MeshFunctionGlobal(
      [](auto x) { return Eigen::Vector2d(2 * x[0], x[1] + 2 * x[0]); });
  checkMeshFunctionEqual(*mesh, mfVectorA + mfVectorB, mfVecAdd);
  checkMeshFunctionEqual(*mesh, mfVectorA_dynamic + mfVectorB, mfVecAdd);
  checkMeshFunctionEqual(*mesh, mfVectorA + mfVectorB_dynamic, mfVecAdd);
  checkMeshFunctionEqual(*mesh, mfVectorA_dynamic + mfVectorB_dynamic,
                         mfVecAdd);
  checkMeshFunctionEqual(*mesh, mfArrayA + mfArrayB, mfVecAdd);
  checkMeshFunctionEqual(*mesh, mfArrayA_dynamic + mfArrayB, mfVecAdd);
  checkMeshFunctionEqual(*mesh, mfArrayA + mfArrayB_dynamic, mfVecAdd);
  checkMeshFunctionEqual(*mesh, mfArrayA_dynamic + mfArrayB_dynamic, mfVecAdd);

  auto matrixSum = mfMatrixA + mfMatrixB;
  checkMeshFunctionEqual(*mesh, matrixSum, MeshFunctionGlobal([](auto x) {
    return (Eigen::Matrix2d() << x[0] * x[0], 1 + x[0] * x[1],
            x[0] * x[1] + x[0], x[1] * x[1] + x[1])
        .finished();
  }));

  auto xSum = mfXA + mfXB;
  checkMeshFunctionEqual(*mesh, xSum, MeshFunctionConstant(X(3)));
}